

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

uint64_t __thiscall BuildLog::LogEntry::HashCommand(LogEntry *this,StringPiece command)

{
  uint64_t uVar1;
  StringPiece command_local;
  
  uVar1 = anon_unknown.dwarf_548b::MurmurHash64A(this,(size_t)command.str_);
  return uVar1;
}

Assistant:

uint64_t BuildLog::LogEntry::HashCommand(StringPiece command) {
  return MurmurHash64A(command.str_, command.len_);
}